

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderNonMessageField
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field,
          StringPiece field_name,ObjectWriter *ow)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  EnumValue *pEVar3;
  stringpiece_ssize_type sVar4;
  char *pcVar5;
  uint *puVar6;
  undefined1 auVar7 [8];
  StringPiece input;
  long lStack_d0;
  string local_c0;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  TypeInfo *local_70;
  undefined1 local_68 [8];
  string strbuffer;
  ulong local_40;
  uint64 buffer64;
  uint32 buffer32;
  
  strbuffer.field_2._8_8_ = field_name.length_;
  pcVar5 = field_name.ptr_;
  local_68 = (undefined1  [8])&strbuffer._M_string_length;
  strbuffer._M_dataplus._M_p = (pointer)0x0;
  strbuffer._M_string_length._0_1_ = 0;
  puVar6 = &switchD_00336716::switchdataD_0036daf8;
  switch(field->kind_) {
  case 1:
    io::CodedInputStream::ReadLittleEndian64(this->stream_,&local_40);
    (*ow->_vptr_ObjectWriter[0xb])(local_40,ow,pcVar5,strbuffer.field_2._8_8_);
    break;
  case 2:
    io::CodedInputStream::ReadLittleEndian32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    (*ow->_vptr_ObjectWriter[0xc])((ulong)buffer64._4_4_,ow,pcVar5,strbuffer.field_2._8_8_);
    break;
  case 3:
    io::CodedInputStream::ReadVarint64(this->stream_,&local_40);
    goto LAB_00336780;
  case 4:
    io::CodedInputStream::ReadVarint64(this->stream_,&local_40);
    goto LAB_00336892;
  case 5:
    io::CodedInputStream::ReadVarint32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    goto LAB_003368bd;
  case 6:
    io::CodedInputStream::ReadLittleEndian64(this->stream_,&local_40);
LAB_00336892:
    lStack_d0 = 0x50;
    goto LAB_00336899;
  case 7:
    io::CodedInputStream::ReadLittleEndian32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    goto LAB_0033680c;
  case 8:
    io::CodedInputStream::ReadVarint64(this->stream_,&local_40);
    (*ow->_vptr_ObjectWriter[6])(ow,pcVar5,strbuffer.field_2._8_8_,(ulong)(local_40 != 0));
    break;
  case 9:
    io::CodedInputStream::ReadVarint32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    io::CodedInputStream::ReadString(this->stream_,(string *)local_68,buffer64._4_4_);
    auVar7 = local_68;
    sVar4 = StringPiece::CheckedSsizeTFromSizeT((size_t)strbuffer._M_dataplus._M_p);
    lStack_d0 = 0x68;
    goto LAB_00336931;
  case 0xc:
    io::CodedInputStream::ReadVarint32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    io::CodedInputStream::ReadString(this->stream_,(string *)local_68,buffer64._4_4_);
    auVar7 = local_68;
    sVar4 = StringPiece::CheckedSsizeTFromSizeT((size_t)strbuffer._M_dataplus._M_p);
    lStack_d0 = 0x70;
LAB_00336931:
    (**(code **)((long)ow->_vptr_ObjectWriter + lStack_d0))
              (ow,pcVar5,strbuffer.field_2._8_8_,auVar7,sVar4);
    break;
  case 0xd:
    io::CodedInputStream::ReadVarint32(this->stream_,(uint32 *)((long)&buffer64 + 4));
LAB_0033680c:
    lStack_d0 = 0x40;
    goto LAB_003368c3;
  case 0xe:
    io::CodedInputStream::ReadVarint32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    bVar1 = std::operator==((field->type_url_).ptr_,"type.googleapis.com/google.protobuf.NullValue")
    ;
    if (bVar1) {
      (*ow->_vptr_ObjectWriter[0xf])(ow,pcVar5,strbuffer.field_2._8_8_);
    }
    else {
      local_70 = this->typeinfo_;
      StringPiece::StringPiece<std::allocator<char>>(&local_a0,(field->type_url_).ptr_);
      iVar2 = (*local_70->_vptr_TypeInfo[4])(local_70,local_a0.ptr_,local_a0.length_);
      if ((Enum *)CONCAT44(extraout_var,iVar2) == (Enum *)0x0) {
        if (this->render_unknown_enum_values_ == true) {
          (*ow->_vptr_ObjectWriter[7])(ow,pcVar5,strbuffer.field_2._8_8_,(ulong)buffer64._4_4_);
        }
      }
      else {
        pEVar3 = anon_unknown_4::FindEnumValueByNumber
                           ((Enum *)CONCAT44(extraout_var,iVar2),buffer64._4_4_);
        if (pEVar3 == (EnumValue *)0x0) {
          if (this->render_unknown_enum_values_ != true) break;
        }
        else if (this->use_ints_for_enums_ == false) {
          if (this->use_lower_camel_for_enums_ == true) {
            StringPiece::StringPiece<std::allocator<char>>(&local_90,(pEVar3->name_).ptr_);
            input.length_ = (stringpiece_ssize_type)puVar6;
            input.ptr_ = (char *)local_90.length_;
            EnumValueNameToLowerCamelCase_abi_cxx11_(&local_c0,(converter *)local_90.ptr_,input);
            sVar4 = StringPiece::CheckedSsizeTFromSizeT(local_c0._M_string_length);
            (*ow->_vptr_ObjectWriter[0xd])
                      (ow,pcVar5,strbuffer.field_2._8_8_,local_c0._M_dataplus._M_p,sVar4);
            std::__cxx11::string::~string((string *)&local_c0);
          }
          else {
            StringPiece::StringPiece<std::allocator<char>>(&local_80,(pEVar3->name_).ptr_);
            (*ow->_vptr_ObjectWriter[0xd])
                      (ow,pcVar5,strbuffer.field_2._8_8_,local_80.ptr_,local_80.length_);
          }
          break;
        }
        (*ow->_vptr_ObjectWriter[7])(ow,pcVar5,strbuffer.field_2._8_8_,(ulong)buffer64._4_4_);
      }
    }
    break;
  case 0xf:
    io::CodedInputStream::ReadLittleEndian32(this->stream_,(uint32 *)((long)&buffer64 + 4));
LAB_003368bd:
    lStack_d0 = 0x38;
LAB_003368c3:
    (**(code **)((long)ow->_vptr_ObjectWriter + lStack_d0))
              (ow,pcVar5,strbuffer.field_2._8_8_,buffer64._4_4_);
    break;
  case 0x10:
    io::CodedInputStream::ReadLittleEndian64(this->stream_,&local_40);
LAB_00336780:
    lStack_d0 = 0x48;
LAB_00336899:
    (**(code **)((long)ow->_vptr_ObjectWriter + lStack_d0))
              (ow,pcVar5,strbuffer.field_2._8_8_,local_40);
    break;
  case 0x11:
    io::CodedInputStream::ReadVarint32(this->stream_,(uint32 *)((long)&buffer64 + 4));
    buffer64._4_4_ = -(buffer64._4_4_ & 1) ^ buffer64._4_4_ >> 1;
    lStack_d0 = 0x38;
    goto LAB_003368c3;
  case 0x12:
    io::CodedInputStream::ReadVarint64(this->stream_,&local_40);
    local_40 = -(ulong)((uint)local_40 & 1) ^ local_40 >> 1;
    lStack_d0 = 0x48;
    goto LAB_00336899;
  }
  Status::Status(__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderNonMessageField(
    const google::protobuf::Field* field, StringPiece field_name,
    ObjectWriter* ow) const {
  // Temporary buffers of different types.
  uint32 buffer32;
  uint64 buffer64;
  std::string strbuffer;
  switch (field->kind()) {
    case google::protobuf::Field::TYPE_BOOL: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderBool(field_name, buffer64 != 0);
      break;
    }
    case google::protobuf::Field::TYPE_INT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderInt32(field_name, bit_cast<int32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_INT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderInt64(field_name, bit_cast<int64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_UINT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_UINT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderUint64(field_name, bit_cast<uint64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_SINT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderInt32(field_name, WireFormatLite::ZigZagDecode32(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_SINT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderInt64(field_name, WireFormatLite::ZigZagDecode64(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED32: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderInt32(field_name, bit_cast<int32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED64: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderInt64(field_name, bit_cast<int64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_FIXED32: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_FIXED64: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderUint64(field_name, bit_cast<uint64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderFloat(field_name, bit_cast<float>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_DOUBLE: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderDouble(field_name, bit_cast<double>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_ENUM: {
      stream_->ReadVarint32(&buffer32);

      // If the field represents an explicit NULL value, render null.
      if (field->type_url() == kStructNullValueTypeUrl) {
        ow->RenderNull(field_name);
        break;
      }

      // Get the nested enum type for this field.
      // TODO(skarvaje): Avoid string manipulation. Find ways to speed this
      // up.
      const google::protobuf::Enum* en =
          typeinfo_->GetEnumByTypeUrl(field->type_url());
      // Lookup the name of the enum, and render that. Unknown enum values
      // are printed as integers.
      if (en != nullptr) {
        const google::protobuf::EnumValue* enum_value =
            FindEnumValueByNumber(*en, buffer32);
        if (enum_value != nullptr) {
          if (use_ints_for_enums_) {
            ow->RenderInt32(field_name, buffer32);
          } else if (use_lower_camel_for_enums_) {
            ow->RenderString(field_name,
                             EnumValueNameToLowerCamelCase(enum_value->name()));
          } else {
            ow->RenderString(field_name, enum_value->name());
          }
        } else if (render_unknown_enum_values_) {
          ow->RenderInt32(field_name, buffer32);
        }
      } else if (render_unknown_enum_values_) {
        ow->RenderInt32(field_name, buffer32);
      }
      break;
    }
    case google::protobuf::Field::TYPE_STRING: {
      stream_->ReadVarint32(&buffer32);  // string size.
      stream_->ReadString(&strbuffer, buffer32);
      ow->RenderString(field_name, strbuffer);
      break;
    }
    case google::protobuf::Field::TYPE_BYTES: {
      stream_->ReadVarint32(&buffer32);  // bytes size.
      stream_->ReadString(&strbuffer, buffer32);
      ow->RenderBytes(field_name, strbuffer);
      break;
    }
    default:
      break;
  }
  return util::Status();
}